

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HouseholderSequence.h
# Opt level: O1

void __thiscall
Eigen::HouseholderSequence<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,1>
::evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>>
          (HouseholderSequence<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,1>
           *this,Matrix<double,__1,__1,_0,__1,__1> *dst,Matrix<double,__1,_1,_0,__1,_1> *workspace)

{
  void *__s;
  long lVar1;
  long lVar2;
  double *pdVar3;
  HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
  *pHVar4;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar5;
  double *pdVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long local_a8;
  double *local_a0;
  ulong local_98;
  ulong local_90;
  Matrix<double,__1,__1,_0,__1,__1> *local_88;
  long local_80;
  double *local_78;
  ulong local_70;
  HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
  *local_68;
  Matrix<double,__1,__1,_0,__1,__1> *local_60;
  EssentialVectorType local_58;
  
  PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&workspace->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             *(Index *)(*(long *)this + 8));
  uVar10 = *(ulong *)(this + 0x18);
  pdVar6 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  if ((pdVar6 == (double *)0x0) || (pdVar6 != (double *)**(undefined8 **)this)) {
    MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setIdentity
              ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)dst,
               *(Index *)(*(long *)this + 8),*(Index *)(*(long *)this + 8));
    if (0 < (long)uVar10) {
      lVar16 = uVar10 + 1;
      lVar9 = -uVar10;
      lVar15 = uVar10 * 8;
      do {
        lVar15 = lVar15 + -8;
        lVar9 = lVar9 + 1;
        lVar1 = *(long *)(*(long *)this + 8);
        lVar2 = *(long *)(this + 0x20);
        local_98 = (lVar1 - lVar2) + lVar9;
        local_90 = local_98;
        if (this[0x10] ==
            (HouseholderSequence<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,1>
             )0x1) {
          lVar14 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                   .m_rows;
          lVar12 = (lVar2 + lVar14) - lVar1;
          uVar10 = (((lVar2 + (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                              ).m_storage.m_cols) - lVar1) + lVar16) - 2;
          local_a0 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_data + uVar10 * lVar14 + lVar16 + lVar12 + -2;
          if (((long)local_98 < 0) && (local_a0 != (double *)0x0)) goto LAB_00129702;
          local_88 = dst;
          local_80 = lVar14;
          if ((long)((lVar12 + lVar16) - 2U | local_98 | uVar10) < 0) goto LAB_001296eb;
          HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
          ::essentialVector(&local_58,
                            (HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                             *)this,lVar16 + -2);
          MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
          applyHouseholderOnTheRight<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>>
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
                     &local_a0,&local_58,(Scalar *)(**(long **)(this + 8) + lVar15),
                     (workspace->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data);
        }
        else {
          lVar14 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                   .m_rows;
          lVar12 = (lVar2 + lVar14) - lVar1;
          uVar10 = (((lVar2 + (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                              ).m_storage.m_cols) - lVar1) + lVar16) - 2;
          local_a0 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_data + uVar10 * lVar14 + lVar16 + lVar12 + -2;
          if (((long)local_98 < 0) && (local_a0 != (double *)0x0)) goto LAB_00129702;
          local_88 = dst;
          local_80 = lVar14;
          if ((long)((lVar12 + lVar16) - 2U | local_98 | uVar10) < 0) goto LAB_001296eb;
          HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
          ::essentialVector(&local_58,
                            (HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                             *)this,lVar16 + -2);
          MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
          applyHouseholderOnTheLeft<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>>
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
                     &local_a0,&local_58,(Scalar *)(**(long **)(this + 8) + lVar15),
                     (workspace->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data);
        }
        lVar16 = lVar16 + -1;
      } while (1 < lVar16);
    }
  }
  else {
    lVar16 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_rows;
    lVar15 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_cols;
    if (lVar16 <= lVar15) {
      lVar15 = lVar16;
    }
    if (lVar15 < 0) {
      pcVar8 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Diagonal<Eigen::Matrix<double, -1, -1>>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Diagonal<Eigen::Matrix<double, -1, -1>>]"
      ;
      goto LAB_00129750;
    }
    for (; lVar15 != 0; lVar15 = lVar15 + -1) {
      *pdVar6 = 1.0;
      pdVar6 = pdVar6 + lVar16 + 1;
    }
    local_a0 = (double *)0x0;
    local_58.
    super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,_0>.
    m_data = (PointerType)dst;
    TriangularView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_10U>::setConstant
              ((TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U> *)&local_58,
               (Scalar *)&local_a0);
    local_68 = (HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                *)this;
    local_60 = dst;
    if (0 < (long)uVar10) {
      lVar16 = uVar10 * 8;
      lVar15 = -uVar10;
      uVar13 = uVar10;
      do {
        pMVar5 = local_60;
        pHVar4 = local_68;
        lVar16 = lVar16 + -8;
        uVar7 = uVar13 - 1;
        lVar9 = (local_68->m_vectors->
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
        lVar1 = local_68->m_shift;
        local_98 = (lVar9 - lVar1) + lVar15 + 1;
        local_90 = local_98;
        if (local_68->m_trans == true) {
          lVar2 = (local_60->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                  m_storage.m_rows;
          lVar14 = (lVar1 + lVar2) - lVar9;
          uVar11 = (((lVar1 + (local_60->
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                              m_storage.m_cols) - lVar9) + uVar13) - 1;
          local_a0 = (local_60->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_data + uVar11 * lVar2 + uVar13 + lVar14 + -1;
          if (((long)local_98 < 0) && (local_a0 != (double *)0x0)) goto LAB_00129702;
          local_88 = local_60;
          local_80 = lVar2;
          if ((long)((uVar13 + lVar14) - 1 | local_98 | uVar11) < 0) goto LAB_001296eb;
          HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
          ::essentialVector(&local_58,local_68,uVar7);
          MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
          applyHouseholderOnTheRight<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>>
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
                     &local_a0,&local_58,
                     (Scalar *)
                     ((long)(pHVar4->m_coeffs->
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                            m_storage.m_data + lVar16),
                     (workspace->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data);
        }
        else {
          lVar2 = (local_60->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                  m_storage.m_rows;
          lVar14 = (lVar1 + lVar2) - lVar9;
          uVar11 = (((lVar1 + (local_60->
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                              m_storage.m_cols) - lVar9) + uVar13) - 1;
          local_a0 = (local_60->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_data + uVar11 * lVar2 + uVar13 + lVar14 + -1;
          if (((long)local_98 < 0) && (local_a0 != (double *)0x0)) goto LAB_00129702;
          local_88 = local_60;
          local_80 = lVar2;
          if ((long)((uVar13 + lVar14) - 1 | local_98 | uVar11) < 0) goto LAB_001296eb;
          HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
          ::essentialVector(&local_58,local_68,uVar7);
          MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
          applyHouseholderOnTheLeft<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>>
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
                     &local_a0,&local_58,
                     (Scalar *)
                     ((long)(pHVar4->m_coeffs->
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                            m_storage.m_data + lVar16),
                     (workspace->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data);
        }
        pdVar6 = (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_data;
        lVar9 = (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                .m_rows;
        if ((lVar9 < 0) && (pdVar6 + lVar9 * uVar7 != (double *)0x0)) goto LAB_00129790;
        local_70 = uVar7;
        if ((pMVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_cols < (long)uVar13) goto LAB_0012971c;
        lVar1 = (pHVar4->m_vectors->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                ).m_storage.m_rows;
        uVar13 = uVar13 + (lVar9 - lVar1);
        uVar11 = lVar15 + lVar1;
        pdVar3 = pdVar6 + lVar9 * uVar7 + uVar13;
        if (((long)uVar11 < 0) && (pdVar3 != (double *)0x0)) goto LAB_00129779;
        if ((long)(uVar13 | uVar11) < 0) goto LAB_0012975a;
        if ((long)uVar11 < 0) goto LAB_0012973b;
        uVar7 = (ulong)((uint)((ulong)pdVar3 >> 3) & 1);
        if ((long)uVar11 <= (long)uVar7) {
          uVar7 = uVar11;
        }
        if (((ulong)pdVar3 & 7) != 0) {
          uVar7 = uVar11;
        }
        local_78 = pdVar6;
        if (0 < (long)uVar7) {
          memset(pdVar3,0,uVar7 * 8);
        }
        lVar14 = lVar15 + (lVar1 - uVar7);
        uVar17 = lVar14 - (lVar14 >> 0x3f) & 0xfffffffffffffffe;
        lVar2 = uVar17 + uVar7;
        if (1 < lVar14) {
          __s = (void *)((long)local_78 + uVar13 * 8 + uVar7 * 8 + lVar9 * lVar16);
          lVar9 = uVar7 + 2;
          if ((long)(uVar7 + 2) < lVar2) {
            lVar9 = lVar2;
          }
          local_78 = pdVar3;
          memset(__s,0,(~uVar7 + lVar9 & 0xfffffffffffffffe) * 8 + 0x10);
          pdVar3 = local_78;
        }
        local_78 = pdVar3;
        if (lVar2 < (long)uVar11) {
          memset(local_78 + (lVar14 / 2) * 2 + uVar7,0,(((lVar1 - uVar7) - uVar17) + lVar15) * 8);
        }
        lVar15 = lVar15 + 1;
        uVar13 = local_70;
      } while (local_70 != 0);
    }
    lVar16 = (local_68->m_vectors->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
             .m_storage.m_rows;
    if ((long)uVar10 < lVar16) {
      lVar9 = -1;
      local_a8 = 0;
      lVar15 = 0;
      do {
        pdVar3 = (local_60->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_data;
        lVar1 = (local_60->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                m_storage.m_rows;
        pdVar6 = pdVar3 + lVar1 * lVar15;
        if (lVar1 < 0 && pdVar6 != (double *)0x0) goto LAB_00129790;
        if ((local_60->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_cols <= lVar15) {
LAB_0012971c:
          __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Block.h"
                        ,0x76,
                        "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                       );
        }
        uVar13 = lVar16 + lVar9;
        pdVar6 = pdVar6 + (lVar1 - lVar16) + lVar15 + 1;
        if (((long)uVar13 < 0) && (pdVar6 != (double *)0x0)) goto LAB_00129779;
        uVar7 = (lVar1 - lVar16) + lVar15 + 1;
        if ((long)(uVar7 | uVar13) < 0) goto LAB_0012975a;
        if ((long)uVar13 < 0) goto LAB_0012973b;
        uVar11 = (ulong)((uint)((ulong)pdVar6 >> 3) & 1);
        if ((long)uVar13 <= (long)uVar11) {
          uVar11 = uVar13;
        }
        if (((ulong)pdVar6 & 7) != 0) {
          uVar11 = uVar13;
        }
        if (0 < (long)uVar11) {
          local_70 = uVar7;
          memset(pdVar6,0,uVar11 * 8);
          uVar7 = local_70;
        }
        lVar2 = lVar9 + (lVar16 - uVar11);
        lVar14 = (lVar2 - (lVar2 >> 0x3f) & 0xfffffffffffffffeU) + uVar11;
        if (1 < lVar2) {
          lVar12 = uVar11 + 2;
          if ((long)(uVar11 + 2) < lVar14) {
            lVar12 = lVar14;
          }
          memset((void *)((long)pdVar3 + uVar7 * 8 + uVar11 * 8 + lVar1 * local_a8),0,
                 (~uVar11 + lVar12 & 0xfffffffffffffffe) * 8 + 0x10);
        }
        if (lVar14 < (long)uVar13) {
          memset(pdVar6 + (lVar2 / 2) * 2 + uVar11,0,
                 (lVar9 + (lVar2 / 2) * -2 + (lVar16 - uVar11)) * 8);
        }
        lVar15 = lVar15 + 1;
        lVar16 = (local_68->m_vectors->
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
        local_a8 = local_a8 + 8;
        lVar9 = lVar9 + -1;
      } while (lVar15 < (long)(lVar16 - uVar10));
    }
  }
  return;
LAB_00129702:
  pcVar8 = 
  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>>, Level = 0]"
  ;
  local_98 = local_90;
  goto LAB_001297a5;
LAB_001296eb:
  pcVar8 = 
  "Eigen::Block<Eigen::Matrix<double, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
  ;
  local_98 = local_90;
  goto LAB_0012976f;
LAB_00129790:
  pcVar8 = 
  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
  ;
  goto LAB_001297a5;
LAB_0012973b:
  pcVar8 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, -1, 1>]"
  ;
LAB_00129750:
  __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/CwiseNullaryOp.h"
                ,0x3f,pcVar8);
LAB_0012975a:
  pcVar8 = 
  "Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
LAB_0012976f:
  __assert_fail("a_startRow >= 0 && blockRows >= 0 && a_startRow <= xpr.rows() - blockRows && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Block.h"
                ,0x8d,pcVar8);
LAB_00129779:
  pcVar8 = 
  "Eigen::MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, -1, 1>, Level = 0]"
  ;
LAB_001297a5:
  __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/MapBase.h"
                ,0x94,pcVar8);
}

Assistant:

void evalTo(Dest& dst, Workspace& workspace) const
    {
      workspace.resize(rows());
      Index vecs = m_length;
      const typename Dest::Scalar *dst_data = internal::extract_data(dst);
      if(    internal::is_same<typename internal::remove_all<VectorsType>::type,Dest>::value
          && dst_data!=0 && dst_data == internal::extract_data(m_vectors))
      {
        // in-place
        dst.diagonal().setOnes();
        dst.template triangularView<StrictlyUpper>().setZero();
        for(Index k = vecs-1; k >= 0; --k)
        {
          Index cornerSize = rows() - k - m_shift;
          if(m_trans)
            dst.bottomRightCorner(cornerSize, cornerSize)
               .applyHouseholderOnTheRight(essentialVector(k), m_coeffs.coeff(k), workspace.data());
          else
            dst.bottomRightCorner(cornerSize, cornerSize)
               .applyHouseholderOnTheLeft(essentialVector(k), m_coeffs.coeff(k), workspace.data());

          // clear the off diagonal vector
          dst.col(k).tail(rows()-k-1).setZero();
        }
        // clear the remaining columns if needed
        for(Index k = 0; k<cols()-vecs ; ++k)
          dst.col(k).tail(rows()-k-1).setZero();
      }
      else
      {
        dst.setIdentity(rows(), rows());
        for(Index k = vecs-1; k >= 0; --k)
        {
          Index cornerSize = rows() - k - m_shift;
          if(m_trans)
            dst.bottomRightCorner(cornerSize, cornerSize)
               .applyHouseholderOnTheRight(essentialVector(k), m_coeffs.coeff(k), &workspace.coeffRef(0));
          else
            dst.bottomRightCorner(cornerSize, cornerSize)
               .applyHouseholderOnTheLeft(essentialVector(k), m_coeffs.coeff(k), &workspace.coeffRef(0));
        }
      }
    }